

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resource.h
# Opt level: O0

StringView Corrade::Utility::Implementation::resourceDataAt(uint *positions,uchar *data,size_t i)

{
  uchar *data_00;
  size_t size;
  uint local_5c;
  StringViewFlags local_58;
  UnderlyingType local_50;
  ulong local_48;
  size_t padding;
  size_t end;
  size_t begin;
  size_t i_local;
  uchar *data_local;
  uint *positions_local;
  
  if (i == 0) {
    local_5c = 0;
  }
  else {
    local_5c = positions[(i - 1) * 2 + 1];
  }
  end = (size_t)local_5c;
  padding = (size_t)positions[i * 2 + 1];
  local_48 = (ulong)*(byte *)((long)positions + i * 8 + 3);
  data_00 = data + end;
  size = (padding - end) - local_48;
  begin = i;
  i_local = (size_t)data;
  data_local = (uchar *)positions;
  Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
            (&local_58,(ulong)(local_48 != 0) << 0x3e);
  local_50 = (UnderlyingType)Containers::operator|(Global,local_58);
  Containers::BasicStringView<const_char>::BasicStringView
            ((BasicStringView<const_char> *)&positions_local,(char *)data_00,size,
             (StringViewFlags)local_50);
  return _positions_local;
}

Assistant:

inline Containers::StringView resourceDataAt(const unsigned int* const positions, const unsigned char* const data, const std::size_t i) {
    /* Every position pair denotes end offsets of one file, data is second */
    const std::size_t begin = i == 0 ? 0 : positions[2*(i - 1) + 1];
    const std::size_t end = positions[2*i + 1];
    /* If there's any padding after (contained in the upper 8 bits of
       filename), the data can be marked as null-terminated. This can be either
       deliberate (a single null byte added after) or "accidental" due to for
       example padding for alignment. */
    const std::size_t padding = (positions[2*i + 0] >> 24 & 0xff);
    return {reinterpret_cast<const char*>(data) + begin, end - begin - padding, Containers::StringViewFlag::Global|(padding ? Containers::StringViewFlag::NullTerminated : Containers::StringViewFlag{})};
}